

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_diff.c
# Opt level: O1

int str_diff(char *s,char *t)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  
  bVar2 = *s;
  if ((bVar2 != 0) && (bVar2 == *t)) {
    pbVar3 = (byte *)(s + 4);
    pbVar1 = (byte *)(t + 2);
    do {
      t = (char *)pbVar1;
      bVar2 = pbVar3[-3];
      if ((bVar2 == 0) || (bVar2 != ((byte *)t)[-1])) {
        t = (char *)((byte *)t + -1);
        goto LAB_001037e0;
      }
      bVar2 = pbVar3[-2];
      if ((bVar2 == 0) || (bVar2 != *t)) goto LAB_001037e0;
      bVar2 = pbVar3[-1];
      if ((bVar2 == 0) || (bVar2 != ((byte *)t)[1])) {
        t = (char *)((byte *)t + 1);
        goto LAB_001037e0;
      }
      bVar2 = *pbVar3;
    } while ((bVar2 != 0) && (pbVar3 = pbVar3 + 4, pbVar1 = (byte *)t + 4, bVar2 == ((byte *)t)[2]))
    ;
    t = (char *)((byte *)t + 2);
  }
LAB_001037e0:
  return (uint)bVar2 - (uint)(byte)*t;
}

Assistant:

int str_diff(register const char *s,register const char *t)
{
  register char x;

  for (;;) {
    x = *s; if (x != *t) break; if (!x) break; ++s; ++t;
    x = *s; if (x != *t) break; if (!x) break; ++s; ++t;
    x = *s; if (x != *t) break; if (!x) break; ++s; ++t;
    x = *s; if (x != *t) break; if (!x) break; ++s; ++t;
  }
  return ((int)(unsigned int)(unsigned char) x)
       - ((int)(unsigned int)(unsigned char) *t);
}